

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayNew *curr)

{
  undefined8 uVar1;
  Literal *pLVar2;
  ulong initialSize;
  long lVar3;
  HeapType heapType;
  Literal local_178;
  Literal local_160;
  undefined1 auStack_148 [8];
  Field field;
  Literals data;
  undefined1 local_f0 [8];
  Flow size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  size_t local_98;
  anon_union_16_5_9943fe1e_for_Literal_0 aStack_90;
  undefined8 uStack_80;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_78;
  pointer pLStack_60;
  char *local_58;
  undefined1 auStack_48 [8];
  Literal value;
  
  local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLStack_60 = (pointer)0x0;
  local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aStack_90.func.super_IString.str._M_str = (char *)0x0;
  uStack_80 = 0;
  local_98 = 0;
  aStack_90.i64 = 0;
  local_58 = (char *)0x0;
  if (curr->init != (Expression *)0x0) {
    visit((Flow *)local_f0,this,curr->init);
    local_98 = (size_t)local_f0;
    ::wasm::Literal::operator=((Literal *)&aStack_90.func,(Literal *)&size);
    data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 =
         (int64_t)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage;
    data.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    field._8_8_ = local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&field.packedType);
    pLStack_60 = size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_58 = (char *)size.breakTo.super_IString.str._M_len;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    ::wasm::Literal::~Literal((Literal *)&size);
    if (local_58 != (char *)0x0) {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = local_98;
      ::wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&aStack_90.func);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = (size_t)pLStack_60;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = local_58;
      goto LAB_0018f96d;
    }
  }
  visit((Flow *)local_f0,this,curr->size);
  if (size.breakTo.super_IString.str._M_len == 0) {
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id == 1) {
      visit(__return_storage_ptr__,this,curr->init);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
        __assert_fail("init.breaking()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0x64e,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew(ArrayNew *) [SubType = wasm::ModuleRunner]"
                     );
      }
    }
    else {
      ::wasm::Type::getHeapType();
      ::wasm::HeapType::getArray();
      if (((long)((long)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3)
          * -0x5555555555555555 + (long)local_f0 != 1) {
LAB_0018f997:
        __assert_fail("values.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0x43,"const Literal &wasm::Flow::getSingleValue()");
      }
      if (size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str != (char *)0x2) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x118,"int32_t wasm::Literal::geti32() const");
      }
      initialSize = (ulong)(uint)size.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      if (0x2aaaaa9 < initialSize) {
        (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
      }
      SmallVector<wasm::Literal,_1UL>::SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&field.packedType,initialSize);
      if (curr->init == (Expression *)0x0) {
        if (initialSize != 0) {
          lVar3 = 0;
          do {
            ::wasm::Literal::makeZero((Type)auStack_48);
            pLVar2 = (Literal *)
                     ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18)
                     + lVar3);
            if (lVar3 == 0) {
              pLVar2 = (Literal *)&data;
            }
            ::wasm::Literal::operator=(pLVar2,(Literal *)auStack_48);
            ::wasm::Literal::~Literal((Literal *)auStack_48);
            lVar3 = lVar3 + 0x18;
          } while (initialSize * 0x18 != lVar3);
        }
      }
      else {
        ::wasm::Type::getHeapType();
        ::wasm::HeapType::getArray();
        auStack_148 = auStack_48;
        field.type.id = value.field_0.i64;
        if (((long)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + local_98
            != 1) goto LAB_0018f997;
        ::wasm::Literal::Literal(&local_178,(Literal *)&aStack_90.func);
        truncateForPacking((Literal *)auStack_48,this,&local_178,(Field *)auStack_148);
        ::wasm::Literal::~Literal(&local_178);
        if (initialSize != 0) {
          lVar3 = 0;
          do {
            pLVar2 = (Literal *)
                     ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18)
                     + lVar3);
            if (lVar3 == 0) {
              pLVar2 = (Literal *)&data;
            }
            ::wasm::Literal::operator=(pLVar2,(Literal *)auStack_48);
            lVar3 = lVar3 + 0x18;
          } while (initialSize * 0x18 != lVar3);
        }
        ::wasm::Literal::~Literal((Literal *)auStack_48);
      }
      auStack_48 = (undefined1  [8])::wasm::Type::getHeapType();
      size.breakTo.super_IString.str._M_str = (char *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
                (&local_a0,(GCData **)&size.breakTo.super_IString.str._M_str,
                 (allocator<wasm::GCData> *)auStack_148,(HeapType *)auStack_48,
                 (Literals *)&field.packedType);
      uVar1 = ::wasm::Type::getHeapType();
      ::wasm::Literal::Literal(&local_160,&size.breakTo.super_IString.str._M_str,uVar1);
      Flow::Flow(__return_storage_ptr__,&local_160);
      ::wasm::Literal::~Literal(&local_160);
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      ::wasm::Literal::~Literal((Literal *)&data);
    }
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_f0;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&size);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)size.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&size);
LAB_0018f96d:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_78);
  ::wasm::Literal::~Literal((Literal *)&aStack_90.func);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNew(ArrayNew* curr) {
    NOTE_ENTER("ArrayNew");
    Flow init;
    if (!curr->isWithDefault()) {
      init = self()->visit(curr->init);
      if (init.breaking()) {
        return init;
      }
    }
    auto size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // visit the unreachable child, and stop there.
      auto init = self()->visit(curr->init);
      assert(init.breaking());
      return init;
    }
    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Index num = size.getSingleValue().geti32();
    if (num >= ArrayLimit) {
      hostLimit("allocation failure");
    }
    Literals data(num);
    if (curr->isWithDefault()) {
      for (Index i = 0; i < num; i++) {
        data[i] = Literal::makeZero(element.type);
      }
    } else {
      auto field = curr->type.getHeapType().getArray().element;
      auto value = truncateForPacking(init.getSingleValue(), field);
      for (Index i = 0; i < num; i++) {
        data[i] = value;
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }